

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGType xVar1;
  ushort uVar2;
  int iVar3;
  xmlRelaxNGDefinePtr pxVar4;
  
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  xVar1 = def->type;
  if (xVar1 == XML_RELAXNG_ELEMENT) {
LAB_00188fd8:
    iVar3 = -1;
    switch(xVar1) {
    case XML_RELAXNG_EMPTY:
    case XML_RELAXNG_TEXT:
switchD_00188ff2_caseD_0:
      iVar3 = 1;
      break;
    case XML_RELAXNG_NOT_ALLOWED:
    case XML_RELAXNG_EXCEPT:
    case XML_RELAXNG_DATATYPE:
    case XML_RELAXNG_PARAM:
    case XML_RELAXNG_VALUE:
    case XML_RELAXNG_LIST:
    case XML_RELAXNG_ATTRIBUTE:
    case XML_RELAXNG_INTERLEAVE:
      iVar3 = 0;
      break;
    case XML_RELAXNG_ELEMENT:
      if ((def->dflags & 0xc0) == 0) {
        pxVar4 = def->content;
        if (pxVar4 != (xmlRelaxNGDefinePtr)0x0) {
          do {
            iVar3 = xmlRelaxNGIsCompilable(pxVar4);
            if (iVar3 != 1) goto LAB_001890ba;
            pxVar4 = pxVar4->next;
          } while (pxVar4 != (xmlRelaxNGDefinePtr)0x0);
          iVar3 = 1;
        }
LAB_001890ba:
        if (iVar3 == 1) {
          uVar2 = (ushort)(byte)((byte)def->dflags >> 7) * 0x40 + 0x40;
        }
        else {
          if (iVar3 != 0) goto LAB_001890f4;
          uVar2 = def->dflags & 0xff3fU | 0x80;
        }
        def->dflags = uVar2;
      }
LAB_001890f4:
      if (def->nameClass == (xmlRelaxNGDefinePtr)0x0) {
        return (uint)(def->name != (xmlChar *)0x0);
      }
      goto LAB_001890fb;
    case XML_RELAXNG_DEF:
    case XML_RELAXNG_OPTIONAL:
    case XML_RELAXNG_ZEROORMORE:
    case XML_RELAXNG_ONEORMORE:
    case XML_RELAXNG_CHOICE:
    case XML_RELAXNG_GROUP:
    case XML_RELAXNG_START:
      pxVar4 = def->content;
      if (pxVar4 != (xmlRelaxNGDefinePtr)0x0) {
        do {
          iVar3 = xmlRelaxNGIsCompilable(pxVar4);
          if (iVar3 != 1) goto switchD_00188ff2_default;
          pxVar4 = pxVar4->next;
        } while (pxVar4 != (xmlRelaxNGDefinePtr)0x0);
        goto switchD_00188ff2_caseD_0;
      }
      break;
    case XML_RELAXNG_REF:
    case XML_RELAXNG_EXTERNALREF:
    case XML_RELAXNG_PARENTREF:
      if (def->depth == -0x14) {
        return 1;
      }
      def->depth = -0x14;
      pxVar4 = def->content;
      while ((pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
             (iVar3 = xmlRelaxNGIsCompilable(pxVar4), iVar3 == 1))) {
        pxVar4 = pxVar4->next;
        iVar3 = 1;
      }
      break;
    case XML_RELAXNG_NOOP:
      iVar3 = xmlRelaxNGIsCompilable(def->content);
    }
switchD_00188ff2_default:
    if (iVar3 == 1) {
      *(byte *)&def->dflags = (byte)def->dflags | 0x40;
    }
    else if (iVar3 == 0) {
      *(byte *)&def->dflags = (byte)def->dflags | 0x80;
    }
  }
  else {
    if ((def->dflags & 0x40) != 0) {
      return 1;
    }
    if ((xVar1 == XML_RELAXNG_ELEMENT) || ((def->dflags & 0x80) == 0)) goto LAB_00188fd8;
LAB_001890fb:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr def)
{
    int ret = -1;

    if (def == NULL) {
        return (-1);
    }
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_COMPILABLE))
        return (1);
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_NOT_COMPILABLE))
        return (0);
    switch (def->type) {
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGIsCompilable(def->content);
            break;
        case XML_RELAXNG_TEXT:
        case XML_RELAXNG_EMPTY:
            ret = 1;
            break;
        case XML_RELAXNG_ELEMENT:
            /*
             * Check if the element content is compilable
             */
            if (((def->dflags & IS_NOT_COMPILABLE) == 0) &&
                ((def->dflags & IS_COMPILABLE) == 0)) {
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
		/*
		 * Because the routine is recursive, we must guard against
		 * discovering both COMPILABLE and NOT_COMPILABLE
		 */
                if (ret == 0) {
		    def->dflags &= ~IS_COMPILABLE;
                    def->dflags |= IS_NOT_COMPILABLE;
		}
                if ((ret == 1) && !(def->dflags &= IS_NOT_COMPILABLE))
                    def->dflags |= IS_COMPILABLE;
            }
            /*
             * All elements return a compilable status unless they
             * are generic like anyName
             */
            if ((def->nameClass != NULL) || (def->name == NULL))
                ret = 0;
            else
                ret = 1;
            return (ret);
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
            if (def->depth == -20) {
                return (1);
            } else {
                xmlRelaxNGDefinePtr list;

                def->depth = -20;
                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
            }
            break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_OPTIONAL:
        case XML_RELAXNG_ZEROORMORE:
        case XML_RELAXNG_ONEORMORE:
        case XML_RELAXNG_CHOICE:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:{
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_NOT_ALLOWED:
            ret = 0;
            break;
    }
    if (ret == 0)
        def->dflags |= IS_NOT_COMPILABLE;
    if (ret == 1)
        def->dflags |= IS_COMPILABLE;
    return (ret);
}